

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammaticalAnalyzer.cpp
# Opt level: O2

void __thiscall
LRGrammaticalAnalyzer::PrintStack
          (LRGrammaticalAnalyzer *this,vector<quadraple,_std::allocator<quadraple>_> *token,int pos,
          stack<int,_std::deque<int,_std::allocator<int>_>_> *stateid,
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *symbol)

{
  pointer pqVar1;
  _Elt_pointer piVar2;
  ostream *poVar3;
  ulong uVar4;
  _Elt_pointer pbVar5;
  long lVar6;
  string sym;
  string tk;
  string st;
  string local_250;
  ofstream analyzeout;
  undefined8 uStack_220;
  uint auStack_218 [122];
  
  st._M_dataplus._M_p = (pointer)&st.field_2;
  st._M_string_length = 0;
  tk._M_dataplus._M_p = (pointer)&tk.field_2;
  tk._M_string_length = 0;
  sym._M_dataplus._M_p = (pointer)&sym.field_2;
  sym._M_string_length = 0;
  st.field_2._M_local_buf[0] = '\0';
  tk.field_2._M_local_buf[0] = '\0';
  sym.field_2._M_local_buf[0] = '\0';
  while (piVar2 = (stateid->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur,
        piVar2 != (stateid->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur) {
    if (piVar2 == (stateid->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar2 = (stateid->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    std::__cxx11::to_string(&local_250,piVar2[-1]);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&analyzeout,
                   &local_250," ");
    std::__cxx11::string::append((string *)&st);
    std::__cxx11::string::~string((string *)&analyzeout);
    std::__cxx11::string::~string((string *)&local_250);
    std::deque<int,_std::allocator<int>_>::pop_back(&stateid->c);
  }
  uVar4 = (ulong)pos;
  lVar6 = uVar4 * 0x48 + 0x20;
  while( true ) {
    pqVar1 = (token->super__Vector_base<quadraple,_std::allocator<quadraple>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(token->super__Vector_base<quadraple,_std::allocator<quadraple>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pqVar1) / 0x48) <= uVar4) break;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&analyzeout,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(pqVar1->tokentype)._M_dataplus._M_p + lVar6)," ");
    std::__cxx11::string::append((string *)&tk);
    std::__cxx11::string::~string((string *)&analyzeout);
    uVar4 = uVar4 + 1;
    lVar6 = lVar6 + 0x48;
  }
  while (pbVar5 = (symbol->c).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur,
        pbVar5 != (symbol->c).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (pbVar5 == (symbol->c).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pbVar5 = (symbol->c).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&analyzeout,
                   pbVar5 + -1," ");
    std::__cxx11::string::append((string *)&sym);
    std::__cxx11::string::~string((string *)&analyzeout);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&symbol->c);
  }
  std::ofstream::ofstream(&analyzeout,"AnalyzeProcess.txt",_S_app);
  *(uint *)((long)auStack_218 + *(long *)(_analyzeout + -0x18)) =
       *(uint *)((long)auStack_218 + *(long *)(_analyzeout + -0x18)) | 0x20;
  *(undefined8 *)((long)&uStack_220 + *(long *)(_analyzeout + -0x18)) = 0x2d;
  poVar3 = std::operator<<((ostream *)&analyzeout,(string *)&st);
  std::operator<<(poVar3,'|');
  *(undefined8 *)((long)&uStack_220 + *(long *)(_analyzeout + -0x18)) = 0x28;
  poVar3 = std::operator<<((ostream *)&analyzeout,(string *)&tk);
  std::operator<<(poVar3,'|');
  *(undefined8 *)((long)&uStack_220 + *(long *)(_analyzeout + -0x18)) = 0x96;
  poVar3 = std::operator<<((ostream *)&analyzeout,(string *)&sym);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ofstream::close();
  std::ofstream::~ofstream(&analyzeout);
  std::__cxx11::string::~string((string *)&sym);
  std::__cxx11::string::~string((string *)&tk);
  std::__cxx11::string::~string((string *)&st);
  return;
}

Assistant:

void LRGrammaticalAnalyzer::PrintStack(std::vector<quadraple> &token, int pos, std::stack<int> stateid,
                                       std::stack<std::string> symbol) {

    std::string st, tk, sym;
    while (!stateid.empty()) {
        //std::cout << stateid.top()<<' ';
        st += std::to_string(stateid.top()) + " ";
        stateid.pop();
    }


    for (int i = pos; i < token.size(); i++)
        //std::cout << token[i].attributevalue << ' ';
        tk += token[i].attributevalue + " ";


    while (!symbol.empty()) {
        //std::cout << symbol.top()<<" ";
        sym += symbol.top() + " ";
        symbol.pop();
    }

    std::ofstream analyzeout("AnalyzeProcess.txt", std::ofstream::app);

    analyzeout.setf(std::ios::left);
    analyzeout.width(45);
    analyzeout << st << '|';
    analyzeout.width(40);
    analyzeout << tk << '|';
    analyzeout.width(150);
    analyzeout << sym << std::endl;

    analyzeout.close();
}